

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O2

Result_t * Kumu::Result_t::Delete(Result_t *__return_storage_ptr__,int v)

{
  Result_t *pRVar1;
  undefined4 uVar2;
  Mutex *__mutex;
  ILogSink *this;
  ulong uVar3;
  map_entry_t *pmVar4;
  uint uVar5;
  
  __mutex = s_MapLock;
  if (v - 100U < 0xffffff39) {
    this = DefaultLogSink();
    ILogSink::Error(this,"Cannot delete core result code: %ld\n",(ulong)(uint)v);
    Result_t(__return_storage_ptr__,(Result_t *)RESULT_FAIL);
  }
  else {
    if (s_MapLock == (Mutex *)0x0) {
      __assert_fail("s_MapLock",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                    ,99,"static Kumu::Result_t Kumu::Result_t::Delete(int)");
    }
    pthread_mutex_lock((pthread_mutex_t *)s_MapLock);
    pmVar4 = s_ResultMap;
    for (uVar3 = 0; s_MapSize != uVar3; uVar3 = uVar3 + 1) {
      if (pmVar4->rcode == v) {
        pmVar4 = s_ResultMap + ((int)uVar3 + 1);
        while (uVar5 = (int)uVar3 + 1, uVar5 < s_MapSize) {
          uVar2 = *(undefined4 *)&pmVar4->field_0x4;
          pRVar1 = pmVar4->result;
          s_ResultMap[uVar3 & 0xffffffff].rcode = pmVar4->rcode;
          *(undefined4 *)&s_ResultMap[uVar3 & 0xffffffff].field_0x4 = uVar2;
          s_ResultMap[uVar3 & 0xffffffff].result = pRVar1;
          pmVar4 = pmVar4 + 1;
          uVar3 = (ulong)uVar5;
        }
        s_MapSize = s_MapSize - 1;
        Result_t(__return_storage_ptr__,(Result_t *)RESULT_OK);
        goto LAB_001162a2;
      }
      pmVar4 = pmVar4 + 1;
    }
    Result_t(__return_storage_ptr__,(Result_t *)RESULT_FALSE);
LAB_001162a2:
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return __return_storage_ptr__;
}

Assistant:

Kumu::Result_t
Kumu::Result_t::Delete(int v)
{
  if ( v < -99 || v > 99 )
    {
      DefaultLogSink().Error("Cannot delete core result code: %ld\n", v);
      return RESULT_FAIL;
    }

  assert(s_MapLock);
  AutoMutex L(*s_MapLock);

  for ( ui32_t i = 0; i < s_MapSize; ++i )
    {
      if ( s_ResultMap[i].rcode == v )
	{
	  for ( ++i; i < s_MapSize; ++i )
	    s_ResultMap[i-1] = s_ResultMap[i];

	  --s_MapSize;
	  return RESULT_OK;
	}
    }

  return RESULT_FALSE;
}